

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O2

FAudio_OPERATIONSET_Operation *
QueueOperation(FAudioVoice *voice,FAudio_OPERATIONSET_Type type,uint32_t operationSet)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  FAudio_OPERATIONSET_Operation *pFVar2;
  FAudio_OPERATIONSET_Operation **ppFVar3;
  FAudio_OPERATIONSET_Operation *pFVar4;
  
  pFVar2 = (FAudio_OPERATIONSET_Operation *)(*voice->audio->pMalloc)(0x30);
  pFVar2->Type = type;
  pFVar2->Voice = voice;
  pFVar2->OperationSet = operationSet;
  pFVar2->next = (FAudio_OPERATIONSET_Operation *)0x0;
  pFVar1 = voice->audio->queuedOperations;
  if (pFVar1 == (FAudio_OPERATIONSET_Operation *)0x0) {
    ppFVar3 = &voice->audio->queuedOperations;
  }
  else {
    do {
      pFVar4 = pFVar1;
      pFVar1 = pFVar4->next;
    } while (pFVar1 != (FAudio_OPERATIONSET_Operation *)0x0);
    ppFVar3 = &pFVar4->next;
  }
  *ppFVar3 = pFVar2;
  return pFVar2;
}

Assistant:

static inline FAudio_OPERATIONSET_Operation* QueueOperation(
	FAudioVoice *voice,
	FAudio_OPERATIONSET_Type type,
	uint32_t operationSet
) {
	FAudio_OPERATIONSET_Operation *latest;
	FAudio_OPERATIONSET_Operation *newop = voice->audio->pMalloc(
		sizeof(FAudio_OPERATIONSET_Operation)
	);

	newop->Type = type;
	newop->Voice = voice;
	newop->OperationSet = operationSet;
	newop->next = NULL;

	if (voice->audio->queuedOperations == NULL)
	{
		voice->audio->queuedOperations = newop;
	}
	else
	{
		latest = voice->audio->queuedOperations;
		while (latest->next != NULL)
		{
			latest = latest->next;
		}
		latest->next = newop;
	}

	return newop;
}